

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_extended_test.cc
# Opt level: O0

void test_multi_readers(multi_reader_type reader_type,char *test_name)

{
  pthread_t __th;
  long lVar1;
  long lVar2;
  size_t sVar3;
  fdb_status fVar4;
  allocator_type *__a;
  size_type *psVar5;
  fdb_config *unaff_RBP;
  char *unaff_retaddr;
  fdb_file_handle **in_stack_00000008;
  int in_stack_0000014c;
  vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *in_stack_00000150;
  fdb_kvs_handle *in_stack_00000158;
  fdb_file_handle *in_stack_00000160;
  fdb_kvs_handle *in_stack_fffffffffffffdd8;
  fdb_file_handle *in_stack_fffffffffffffde0;
  value_type *__value;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  int iVar6;
  vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *pvStack_200;
  int i_2;
  size_t i_1;
  size_t i;
  reader_thread_args *args;
  void **thread_ret;
  pthread_t *tid;
  undefined1 local_1c1 [9];
  undefined1 local_1b8 [8];
  vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> docs;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  size_t n_readers;
  fdb_kvs_handle *pfStack_80;
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int num_docs;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  char *test_name_local;
  multi_reader_type reader_type_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  sVar3 = num_readers;
  system("rm -rf  test.fdb* > errorlog.txt");
  getDefaultConfig();
  fdb_get_default_kvs_config();
  fVar4 = fdb_open(in_stack_00000008,unaff_retaddr,unaff_RBP);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x20b);
    test_multi_readers::__test_pass = 0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                    ,0x20b,"void test_multi_readers(multi_reader_type, const char *)");
    }
  }
  fVar4 = fdb_kvs_open_default
                    (in_stack_fffffffffffffde0,(fdb_kvs_handle **)in_stack_fffffffffffffdd8,
                     (fdb_kvs_config *)0x10432b);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x20d);
    test_multi_readers::__test_pass = 0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                    ,0x20d,"void test_multi_readers(multi_reader_type, const char *)");
    }
  }
  fVar4 = fdb_set_log_callback(pfStack_80,logCallbackFunc,"multi_reader_thread");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x211);
    test_multi_readers::__test_pass = 0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                    ,0x211,"void test_multi_readers(multi_reader_type, const char *)");
    }
  }
  __a = (allocator_type *)0x186a0;
  local_1c1._1_8_ = 0;
  __value = (value_type *)local_1c1;
  std::allocator<fdb_doc_struct_*>::allocator((allocator<fdb_doc_struct_*> *)0x10442b);
  std::vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>::vector
            (pvStack_200,CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),__value,__a);
  std::allocator<fdb_doc_struct_*>::~allocator((allocator<fdb_doc_struct_*> *)0x10445a);
  loadDocsWithRandomKeys(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_0000014c);
  fdb_kvs_close(in_stack_fffffffffffffdd8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffdd8);
  lVar1 = -0x228 - (sVar3 * 8 + 0xf & 0xfffffffffffffff0);
  lVar2 = lVar1 - (sVar3 * 8 + 0xf & 0xfffffffffffffff0);
  psVar5 = (size_type *)(&stack0xfffffffffffffdd8 + sVar3 * -0x30 + lVar2 + 0x228);
  for (i_1 = 0; i_1 < sVar3; i_1 = i_1 + 1) {
    *(int *)(psVar5 + i_1 * 6) = (int)i_1;
    psVar5[i_1 * 6 + 1] = 100000;
    psVar5[i_1 * 6 + 2] = (size_type)local_1b8;
    psVar5[i_1 * 6 + 3] = (size_type)&kvs_config.custom_cmp_param;
    psVar5[i_1 * 6 + 4] =
         (size_type)
         &docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)(psVar5 + i_1 * 6 + 5) = 1;
    if (reader_type == MULTI_READERS) {
      psVar5[-1] = 0x1045f5;
      pthread_create((pthread_t *)(&stack0xfffffffffffffdd8 + i_1 * 8 + lVar1 + 0x228),
                     (pthread_attr_t *)0x0,_reader_thread,psVar5 + i_1 * 6);
    }
    else if (reader_type == MULTI_SNAPSHOT_READERS) {
      psVar5[-1] = 0x10467d;
      pthread_create((pthread_t *)(&stack0xfffffffffffffdd8 + i_1 * 8 + lVar1 + 0x228),
                     (pthread_attr_t *)0x0,_snapshot_reader_thread,psVar5 + i_1 * 6);
    }
    else if ((i_1 & 1) == 0) {
      psVar5[-1] = 0x104703;
      pthread_create((pthread_t *)(&stack0xfffffffffffffdd8 + i_1 * 8 + lVar1 + 0x228),
                     (pthread_attr_t *)0x0,_snapshot_reader_thread,psVar5 + i_1 * 6);
    }
    else {
      psVar5[-1] = 0x1046ca;
      pthread_create((pthread_t *)(&stack0xfffffffffffffdd8 + i_1 * 8 + lVar1 + 0x228),
                     (pthread_attr_t *)0x0,_reader_thread,psVar5 + i_1 * 6);
    }
  }
  for (pvStack_200 = (vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)0x0;
      pvStack_200 < sVar3;
      pvStack_200 = (vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)
                    ((long)pvStack_200 + 1)) {
    __th = *(pthread_t *)(&stack0xfffffffffffffdd8 + (long)pvStack_200 * 8 + lVar1 + 0x228);
    psVar5[-1] = 0x10475d;
    pthread_join(__th,(void **)(&stack0xfffffffffffffdd8 + (long)pvStack_200 * 8 + lVar2 + 0x228));
  }
  for (iVar6 = 0; iVar6 < 100000; iVar6 = iVar6 + 1) {
    psVar5[-1] = 0x10479d;
    std::vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>::at
              ((vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)psVar5[1],*psVar5);
    psVar5[-1] = 0x1047b5;
    fdb_doc_free((fdb_doc *)psVar5[-1]);
  }
  psVar5[-1] = 0x1047cf;
  fdb_shutdown();
  psVar5[-1] = 0x1047d6;
  memleak_end();
  if (test_multi_readers::__test_pass == 0) {
    psVar5[-1] = 0x10481b;
    fprintf(_stderr,"%s FAILED\n",test_name);
  }
  else {
    psVar5[-1] = 0x1047fd;
    fprintf(_stderr,"%s PASSED\n",test_name);
  }
  psVar5[-1] = 0x104827;
  std::vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>::~vector
            ((vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)psVar5[3]);
  return;
}

Assistant:

static void test_multi_readers(multi_reader_type reader_type,
                               const char *test_name) {
    TEST_INIT();
    memleak_start();

    int r;
    int num_docs = 100000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    size_t n_readers = num_readers;

    // remove previous extended_test files
    r = system(SHELL_DEL" test.fdb* > errorlog.txt");
    (void)r;

    fdb_config fconfig = getDefaultConfig();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, test_filename, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "multi_reader_thread");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create a vector of docs on the heap
    std::vector<fdb_doc *> docs(num_docs, nullptr);

    // Load the initial documents with random keys.
    loadDocsWithRandomKeys(dbfile, db, &docs, num_docs);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // create reader threads.
    thread_t *tid = alca(thread_t, n_readers);
    void **thread_ret = alca(void *, n_readers);
    struct reader_thread_args *args = alca(struct reader_thread_args, n_readers);
    for (size_t i = 0; i < n_readers; ++i){
        args[i].tid = i;
        args[i].ndocs = num_docs;
        args[i].docs = &docs;
        args[i].config = &fconfig;
        args[i].kvs_config = &kvs_config;
        args[i].check_body = 1;
        if (reader_type == MULTI_READERS) {
            thread_create(&tid[i], _reader_thread, &args[i]);
        } else if (reader_type == MULTI_SNAPSHOT_READERS) {
            thread_create(&tid[i], _snapshot_reader_thread, &args[i]);
        } else { // mixed
            if (i % 2) {
                thread_create(&tid[i], _reader_thread, &args[i]);
            } else {
                thread_create(&tid[i], _snapshot_reader_thread, &args[i]);
            }
        }
    }

    // wait for thread termination
    for (size_t i = 0; i < n_readers; ++i){
        thread_join(tid[i], &thread_ret[i]);
    }

    // free all documents
    for (int i = 0 ; i < num_docs; ++i){
        fdb_doc_free(docs.at(i));
    }

    // shutdown
    fdb_shutdown();

    memleak_end();
    TEST_RESULT(test_name);
}